

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_get_pointer(Integer memhandle,void *pointer)

{
  Boolean BVar1;
  undefined8 *in_RSI;
  AD *ad;
  AD **in_stack_00000020;
  Integer in_stack_00000028;
  long local_20;
  ulong local_8;
  
  ma_stats.calls[9] = ma_stats.calls[9] + 1;
  BVar1 = mh2ad(in_stack_00000028,in_stack_00000020,memhandle._4_4_,(char *)pointer);
  if (BVar1 != 0) {
    *in_RSI = *(undefined8 *)(local_20 + 0x30);
  }
  local_8 = (ulong)(BVar1 != 0);
  return local_8;
}

Assistant:

public Boolean MA_get_pointer(
    Integer    memhandle,    /* block to get pointer for */
    void    *pointer     /* RETURN: base pointer */)
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_pointer]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (mh2ad(memhandle, &ad, BL_HeapOrStack, "MA_get_pointer"))
    {
        /* compute pointer */
#if 0
        *pointer = ad->client_space;
#endif
        *(char**)pointer = ad->client_space;

        /* success */
        return MA_TRUE;
    }
    else
    {
        /* failure */
        return MA_FALSE;
    }
}